

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::Next
          (CopyingOutputStreamAdaptor *this,void **data,int *size)

{
  bool bVar1;
  uchar *puVar2;
  int iVar3;
  
  if ((this->buffer_used_ == this->buffer_size_) && (bVar1 = WriteBuffer(this), !bVar1)) {
    return false;
  }
  if ((this->buffer_)._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) {
    iVar3 = -1;
    if (-1 < this->buffer_size_) {
      iVar3 = this->buffer_size_;
    }
    puVar2 = (uchar *)operator_new__((long)iVar3);
    (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
    ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar2;
  }
  iVar3 = this->buffer_used_;
  *data = (this->buffer_)._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + iVar3;
  *size = this->buffer_size_ - iVar3;
  this->buffer_used_ = this->buffer_size_;
  return true;
}

Assistant:

bool CopyingOutputStreamAdaptor::Next(void** data, int* size) {
  if (buffer_used_ == buffer_size_) {
    if (!WriteBuffer()) return false;
  }

  AllocateBufferIfNeeded();

  *data = buffer_.get() + buffer_used_;
  *size = buffer_size_ - buffer_used_;
  buffer_used_ = buffer_size_;
  return true;
}